

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::uLessThan(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint uVar1;
  uint uVar2;
  
  requireDStackDepth(this,2,"U<");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,(&this->False)[uVar2 < uVar1]);
  return;
}

Assistant:

void uLessThan() {
			REQUIRE_DSTACK_DEPTH(2, "U<");
			auto u2 = static_cast<Cell>(dStack.getTop()); pop();
			dStack.setTop(static_cast<Cell>(dStack.getTop()) < u2 ? True : False);
		}